

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
SetPropertyValueInfo
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          PropertyValueInfo *info,RecyclableObject *instance,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor)

{
  PropertyAttributes PVar1;
  unsigned_short uVar2;
  
  if (info != (PropertyValueInfo *)0x0) {
    PVar1 = descriptor->Attributes;
    uVar2 = descriptor->propertyIndex;
    info->m_instance = instance;
    info->m_propertyIndex = uVar2;
    info->m_attributes = PVar1;
    info->flags = InlineCacheNoFlags;
    if (((uint)*descriptor & 6) != 2) {
      *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
    }
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyValueInfo(PropertyValueInfo* info, RecyclableObject* instance, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor)
    {
        SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
        if (descriptor->IsOrMayBecomeFixed())
        {
            PropertyValueInfo::DisableStoreFieldCache(info);
        }
    }